

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderMatcher.h
# Opt level: O2

void __thiscall OrderMatcher::display(OrderMatcher *this)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"SYMBOLS:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"--------");
  std::endl<char,std::char_traits<char>>(poVar1);
  for (p_Var2 = (this->m_markets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->m_markets)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)(p_Var2 + 1));
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return;
}

Assistant:

void display() const {
    std::cout << "SYMBOLS:" << std::endl;
    std::cout << "--------" << std::endl;

    Markets::const_iterator i;
    for (i = m_markets.begin(); i != m_markets.end(); ++i) {
      std::cout << i->first << std::endl;
    }
  }